

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
boost::numeric::ublas::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
          *v)

{
  long lVar1;
  fmtflags __fmtfl;
  streamsize __prec;
  ostream *poVar2;
  const_reference pdVar3;
  char *pcVar4;
  vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  *in_RSI;
  ostream *in_RDI;
  size_type i;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  size_type size;
  ios_base *in_stack_fffffffffffffdb8;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffdc0;
  string local_1d8 [32];
  ulong local_1b8;
  locale local_1b0 [8];
  locale local_1a8 [24];
  long local_190 [47];
  size_type local_18;
  vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  ::operator()(in_RSI);
  local_18 = matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             ::size((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     *)0x108d6c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  lVar1 = *(long *)(local_190[0] + -0x18);
  __fmtfl = std::ios_base::flags((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  std::ios_base::flags((ios_base *)((long)local_190 + lVar1),__fmtfl);
  std::ios_base::getloc(in_stack_fffffffffffffdb8);
  std::ios::imbue(local_1a8);
  std::locale::~locale(local_1a8);
  std::locale::~locale(local_1b0);
  lVar1 = *(long *)(local_190[0] + -0x18);
  __prec = std::ios_base::precision((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  std::ios_base::precision((ios_base *)((long)local_190 + lVar1),__prec);
  poVar2 = std::operator<<((ostream *)local_190,'[');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  std::operator<<(poVar2,"](");
  if (local_18 != 0) {
    vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
    ::operator()(local_10);
    pdVar3 = matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             ::operator()(in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    std::ostream::operator<<((ostream *)local_190,*pdVar3);
  }
  for (local_1b8 = 1; local_1b8 < local_18; local_1b8 = local_1b8 + 1) {
    poVar2 = std::operator<<((ostream *)local_190,',');
    vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
    ::operator()(local_10);
    pdVar3 = matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             ::operator()(in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    std::ostream::operator<<(poVar2,*pdVar3);
  }
  std::operator<<((ostream *)local_190,')');
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(local_8,pcVar4);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return (basic_ostream<char,_std::char_traits<char>_> *)poVar2;
}

Assistant:

std::basic_ostream<E, T> &operator << (std::basic_ostream<E, T> &os,
                                           const vector_expression<VE> &v) {
        typedef typename VE::size_type size_type;
        size_type size = v ().size ();
        std::basic_ostringstream<E, T, std::allocator<E> > s;
        s.flags (os.flags ());
        s.imbue (os.getloc ());
        s.precision (os.precision ());
        s << '[' << size << "](";
        if (size > 0)
            s << v () (0);
        for (size_type i = 1; i < size; ++ i)
            s << ',' << v () (i);
        s << ')';
        return os << s.str ().c_str ();
    }